

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guest-random.c
# Opt level: O0

int glib_random_bytes(void *buf,size_t len)

{
  size_t *psVar1;
  GRand *pGVar2;
  undefined8 *puVar3;
  guint32 local_2c;
  GRand *pGStack_28;
  uint32_t x;
  size_t i;
  GRand *rand;
  size_t len_local;
  void *buf_local;
  
  rand = (GRand *)len;
  len_local = (size_t)buf;
  psVar1 = (size_t *)__tls_get_addr(&PTR_0179ea98);
  i = *psVar1;
  if (i == 0) {
    pGVar2 = g_rand_new();
    i = (size_t)pGVar2;
    puVar3 = (undefined8 *)__tls_get_addr(&PTR_0179ea98);
    *puVar3 = pGVar2;
  }
  for (pGStack_28 = (GRand *)0x0; (GRand *)(pGStack_28->mt + 1) <= rand;
      pGStack_28 = (GRand *)(pGStack_28->mt + 1)) {
    local_2c = g_rand_int((GRand *)i);
    *(guint32 *)((long)pGStack_28->mt + len_local) = local_2c;
  }
  if (pGStack_28 < rand) {
    local_2c = g_rand_int((GRand *)i);
    memcpy((void *)((long)pGStack_28->mt + len_local),&local_2c,(long)pGStack_28 - (long)rand);
  }
  return 0;
}

Assistant:

static int glib_random_bytes(void *buf, size_t len)
{
#ifndef _MSC_VER
    GRand *rand = thread_rand;
    size_t i;
    uint32_t x;

    if (unlikely(rand == NULL)) {
        /* Thread not initialized for a cpu, or main w/o -seed.  */
        thread_rand = rand = g_rand_new();
    }

    for (i = 0; i + 4 <= len; i += 4) {
        x = g_rand_int(rand);
        __builtin_memcpy(buf + i, &x, 4);
    }
    if (i < len) {
        x = g_rand_int(rand);
        __builtin_memcpy(buf + i, &x, i - len);
    }
#endif
    return 0;
}